

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# JsonIO.hh
# Opt level: O3

void __thiscall avro::json::JsonGenerator::encodeNumber<float>(JsonGenerator *this,float t)

{
  ostringstream oss;
  long *local_1a8;
  size_t local_1a0;
  long local_198 [2];
  ostringstream local_188 [112];
  ios_base local_118 [264];
  
  sep(this);
  std::__cxx11::ostringstream::ostringstream(local_188);
  std::ostream::_M_insert<double>((double)t);
  std::__cxx11::stringbuf::str();
  StreamWriter::writeBytes(&this->out_,(uint8_t *)local_1a8,local_1a0);
  if (this->top == stKey) {
    this->top = stMapN;
  }
  if (local_1a8 != local_198) {
    operator_delete(local_1a8,local_198[0] + 1);
  }
  std::__cxx11::ostringstream::~ostringstream(local_188);
  std::ios_base::~ios_base(local_118);
  return;
}

Assistant:

void encodeNumber(T t) {
        sep();
        std::ostringstream oss;
        oss << t;
        const std::string& s = oss.str();
        out_.writeBytes(reinterpret_cast<const uint8_t*>(&s[0]), s.size());
        sep2();
    }